

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

bool Js::IsWhiteSpaceCharacter(char16 ch)

{
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  char16 ch_local;
  
  local_b = false;
  if (8 < (ushort)ch) {
    local_c = true;
    if ((0xd < (ushort)ch) &&
       ((0x200a < (ushort)ch ||
        ((((local_c = true, (ushort)ch < 0x2000 && (local_c = true, ch != L' ')) &&
          (local_c = true, ch != L'\xa0')) && (local_c = true, ch != L'\x1680')))))) {
      local_d = false;
      if (0x2027 < (ushort)ch) {
        local_e = true;
        if (((0x2029 < (ushort)ch) && (local_e = true, ch != L'\x202f')) &&
           ((local_e = true, ch != L'\x205f' && (local_e = true, ch != L'\x3000')))) {
          local_e = ch == L'\xfeff';
        }
        local_d = local_e;
      }
      local_c = local_d;
    }
    local_b = local_c;
  }
  return local_b;
}

Assistant:

bool IsWhiteSpaceCharacter(char16 ch)
    {
        return ch >= 0x9 &&
            (ch <= 0xd ||
                (ch <= 0x200a &&
                    (ch >= 0x2000 || ch == 0x20 || ch == 0xa0 || ch == 0x1680)
                ) ||
                (ch >= 0x2028 &&
                    (ch <= 0x2029 || ch == 0x202f || ch == 0x205f || ch == 0x3000 || ch == 0xfeff)
                )
            );
    }